

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O3

ggml_backend_reg_t ggml_backend_load_best(char *name,bool silent,char *user_search_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var4;
  char cVar5;
  uint uVar6;
  int iVar7;
  value_type_conflict *__val;
  long *plVar8;
  ssize_t sVar9;
  path *ppVar10;
  long lVar11;
  void *pvVar12;
  code *pcVar13;
  ggml_backend_reg_t extraout_RAX;
  size_type *psVar14;
  pointer ppVar15;
  pointer __lhs;
  undefined7 in_register_00000031;
  path *__p;
  char *pcVar16;
  undefined1 auVar17 [16];
  string base_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  directory_iterator __begin2;
  path best_path;
  directory_iterator dir_it;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  search_paths;
  path file_extension;
  path file_prefix;
  path name_path;
  int local_1bc;
  path local_1b8;
  path local_190;
  path local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  path local_120;
  string_type local_f8;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> local_d8;
  char *local_c0;
  path *local_b8;
  path local_b0;
  path local_88;
  path local_60;
  char *local_38;
  
  local_c0 = (char *)CONCAT71(in_register_00000031,silent);
  local_38 = name;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_60,&local_38,auto_format);
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            (&local_b0,(char (*) [9])"libggml-",auto_format);
  std::operator+(&local_168._M_pathname,&local_b0._M_pathname,&local_60._M_pathname);
  std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
            (&local_120,(char (*) [2])0x10732e,auto_format);
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_168,(ulong)local_120._M_pathname._M_dataplus._M_p);
  paVar1 = &local_1b8._M_pathname.field_2;
  psVar14 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_1b8._M_pathname.field_2._M_allocated_capacity = *psVar14;
    local_1b8._M_pathname.field_2._8_8_ = plVar8[3];
    local_1b8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1b8._M_pathname.field_2._M_allocated_capacity = *psVar14;
    local_1b8._M_pathname._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_1b8._M_pathname._M_string_length = plVar8[1];
  *plVar8 = (long)psVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::filesystem::__cxx11::path::path(&local_88,&local_1b8._M_pathname,auto_format);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_pathname._M_dataplus._M_p,
                    local_1b8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_120);
  paVar2 = &local_168._M_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_168._M_pathname._M_dataplus._M_p,
                    local_168._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
            (&local_b0,(char (*) [4])".so",auto_format);
  local_d8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (path *)0x0;
  local_d8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (path *)0x0;
  local_d8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_c0 == (char *)0x0) {
    local_1b8._M_pathname.field_2._M_allocated_capacity._0_2_ = 0x2e;
    local_1b8._M_pathname._M_string_length = 1;
    local_1b8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    local_190._M_pathname._M_dataplus._M_p = (pointer)operator_new(0x400);
    pcVar16 = local_190._M_pathname._M_dataplus._M_p + 0x400;
    local_190._M_pathname.field_2._M_allocated_capacity = (size_type)pcVar16;
    memset(local_190._M_pathname._M_dataplus._M_p,0,0x400);
    local_190._M_pathname._M_string_length = (size_type)pcVar16;
    while (sVar9 = readlink("/proc/self/exe",local_190._M_pathname._M_dataplus._M_p,
                            local_190._M_pathname._M_string_length -
                            (long)local_190._M_pathname._M_dataplus._M_p), sVar9 != -1) {
      if (sVar9 < (long)(local_190._M_pathname._M_string_length -
                        (long)local_190._M_pathname._M_dataplus._M_p)) {
        local_168._M_pathname._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_168,local_190._M_pathname._M_dataplus._M_p,
                   local_190._M_pathname._M_dataplus._M_p + sVar9);
        std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_pathname._M_dataplus._M_p != paVar2) {
          operator_delete(local_168._M_pathname._M_dataplus._M_p,
                          local_168._M_pathname.field_2._M_allocated_capacity + 1);
        }
        lVar11 = std::__cxx11::string::rfind((char)&local_1b8,0x2f);
        if (lVar11 != -1) {
          std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_1b8);
          std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_pathname._M_dataplus._M_p != paVar2) {
            operator_delete(local_168._M_pathname._M_dataplus._M_p,
                            local_168._M_pathname.field_2._M_allocated_capacity + 1);
          }
        }
        break;
      }
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)&local_190,
                 (local_190._M_pathname._M_string_length -
                 (long)local_190._M_pathname._M_dataplus._M_p) * 2);
    }
    local_168._M_pathname._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,local_1b8._M_pathname._M_dataplus._M_p,
               local_1b8._M_pathname._M_dataplus._M_p + local_1b8._M_pathname._M_string_length);
    std::__cxx11::string::append((char *)&local_168);
    std::filesystem::__cxx11::path::path(&local_120,&local_168._M_pathname,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_168._M_pathname._M_dataplus._M_p,
                      local_168._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_pathname._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_190._M_pathname._M_dataplus._M_p,
                      local_190._M_pathname.field_2._M_allocated_capacity -
                      (long)local_190._M_pathname._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_pathname._M_dataplus._M_p,
                      local_1b8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    emplace_back<std::filesystem::__cxx11::path>(&local_d8,&local_120);
    std::filesystem::__cxx11::path::~path(&local_120);
    std::filesystem::current_path_abi_cxx11_();
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    emplace_back<std::filesystem::__cxx11::path>(&local_d8,&local_120);
  }
  else {
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_120,&local_c0,auto_format);
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    emplace_back<std::filesystem::__cxx11::path>(&local_d8,&local_120);
  }
  std::filesystem::__cxx11::path::~path(&local_120);
  std::filesystem::__cxx11::path::path(&local_120);
  local_b8 = local_d8.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_d8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_d8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_190._M_pathname.field_2;
    local_1bc = 0;
    ppVar15 = local_d8.
              super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      cVar5 = std::filesystem::status(ppVar15);
      if ((cVar5 == -1) || (cVar5 == '\0')) {
        path_str(&local_1b8._M_pathname,(path *)(ppVar15->_M_pathname)._M_dataplus._M_p);
        ggml_log_internal(1,"%s: search path %s does not exist\n","ggml_backend_load_best");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_pathname._M_dataplus._M_p != &local_1b8._M_pathname.field_2) {
          operator_delete(local_1b8._M_pathname._M_dataplus._M_p,
                          local_1b8._M_pathname.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::filesystem::__cxx11::directory_iterator::directory_iterator
                  ((directory_iterator *)&local_f8,ppVar15,skip_permission_denied,(error_code *)0x0)
        ;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_140._M_dataplus._M_p = local_f8._M_dataplus._M_p;
          local_140._M_string_length = 0;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_f8._M_string_length + 8) = *(int *)(local_f8._M_string_length + 8) + 1;
            UNLOCK();
            local_140._M_dataplus._M_p = local_f8._M_dataplus._M_p;
            local_140._M_string_length = local_f8._M_string_length;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001051cb;
          }
          else {
            *(int *)(local_f8._M_string_length + 8) = *(int *)(local_f8._M_string_length + 8) + 1;
          }
          local_140._M_dataplus._M_p = local_f8._M_dataplus._M_p;
          local_140._M_string_length = local_f8._M_string_length;
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_f8._M_string_length + 8) = *(int *)(local_f8._M_string_length + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_f8._M_string_length + 8) = *(int *)(local_f8._M_string_length + 8) + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
        }
LAB_001051cb:
        while( true ) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_string_length ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) break;
          ppVar10 = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                                      ((directory_iterator *)&local_140);
          cVar5 = *(char *)&ppVar10[1]._M_pathname._M_dataplus._M_p;
          if ((cVar5 == '\x03') || (cVar5 == '\0')) {
            cVar5 = std::filesystem::status(ppVar10);
          }
          if (cVar5 == '\x01') {
            sVar3 = (ppVar10->_M_pathname)._M_string_length;
            if (sVar3 == 0) {
LAB_00105266:
              std::filesystem::__cxx11::path::path(&local_1b8);
            }
            else {
              _Var4._M_head_impl =
                   (ppVar10->_M_cmpts)._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl;
              uVar6 = (uint)_Var4._M_head_impl;
              __p = ppVar10;
              if ((~(byte)_Var4._M_head_impl & 3) != 0) {
                if ((((ulong)_Var4._M_head_impl & 3) == 0) &&
                   ((ppVar10->_M_pathname)._M_dataplus._M_p[sVar3 - 1] != '/')) {
                  if (((ulong)_Var4._M_head_impl & 3) == 0) {
                    lVar11 = std::filesystem::__cxx11::path::_List::end();
                    __p = (path *)(lVar11 + -0x30);
                    if (((ulong)(ppVar10->_M_cmpts)._M_impl._M_t.
                                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                .
                                super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                ._M_head_impl & 3) != 0) {
                      __p = ppVar10;
                    }
                    uVar6 = (uint)(__p->_M_cmpts)._M_impl._M_t.
                                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  .
                                  super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                  ._M_head_impl;
                  }
                  if ((~uVar6 & 3) == 0) goto LAB_0010525c;
                }
                goto LAB_00105266;
              }
LAB_0010525c:
              std::filesystem::__cxx11::path::path(&local_1b8,__p);
            }
            auVar17 = std::filesystem::__cxx11::path::_M_find_extension();
            if (auVar17._8_8_ == -1 || auVar17._0_8_ == 0) {
              std::filesystem::__cxx11::path::path(&local_168);
            }
            else {
              std::__cxx11::string::substr((ulong)&local_190,auVar17._0_8_);
              std::filesystem::__cxx11::path::path(&local_168,&local_190._M_pathname,auto_format);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_pathname._M_dataplus._M_p != paVar1) {
                operator_delete(local_190._M_pathname._M_dataplus._M_p,
                                (ulong)(local_190._M_pathname.field_2._M_allocated_capacity + 1));
              }
            }
            local_190._M_pathname._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_190,local_88._M_pathname._M_dataplus._M_p,
                       local_88._M_pathname._M_dataplus._M_p + local_88._M_pathname._M_string_length
                      );
            lVar11 = std::__cxx11::string::find
                               ((char *)&local_1b8,(ulong)local_190._M_pathname._M_dataplus._M_p,0);
            if (lVar11 == 0) {
              iVar7 = std::filesystem::__cxx11::path::compare(&local_168);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_pathname._M_dataplus._M_p != paVar1) {
                operator_delete(local_190._M_pathname._M_dataplus._M_p,
                                (ulong)(local_190._M_pathname.field_2._M_allocated_capacity + 1));
              }
              if ((iVar7 == 0) &&
                 (pvVar12 = dl_load_library((path *)(ppVar10->_M_pathname)._M_dataplus._M_p),
                 pvVar12 != (void *)0x0)) {
                pcVar13 = (code *)dlsym(pvVar12,"ggml_backend_score");
                if ((pcVar13 != (code *)0x0) && (iVar7 = (*pcVar13)(), local_1bc < iVar7)) {
                  std::filesystem::__cxx11::path::operator=(&local_120,ppVar10);
                  local_1bc = iVar7;
                }
                dlclose(pvVar12);
              }
            }
            else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_190._M_pathname._M_dataplus._M_p != paVar1) {
              operator_delete(local_190._M_pathname._M_dataplus._M_p,
                              (ulong)(local_190._M_pathname.field_2._M_allocated_capacity + 1));
            }
            std::filesystem::__cxx11::path::~path(&local_168);
            std::filesystem::__cxx11::path::~path(&local_1b8);
          }
          std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)&local_140)
          ;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
        }
      }
      ppVar15 = ppVar15 + 1;
    } while (ppVar15 != local_b8);
    if (local_1bc != 0) {
      get_reg();
      ggml_backend_registry::load_backend(&get_reg::reg,&local_120,true);
      goto LAB_001055e8;
    }
  }
  ppVar15 = local_d8.
            super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_d8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_d8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __lhs = local_d8.
            super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
                (&local_168,(char (*) [9])"libggml-",auto_format);
      std::operator+(&local_140,&local_168._M_pathname,&local_60._M_pathname);
      std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
                (&local_190,(char (*) [4])".so",auto_format);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_140,(ulong)local_190._M_pathname._M_dataplus._M_p);
      psVar14 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_f8.field_2._M_allocated_capacity = *psVar14;
        local_f8.field_2._8_8_ = plVar8[3];
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar14;
        local_f8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_f8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::filesystem::__cxx11::path::path(&local_1b8,&local_f8,auto_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_168);
      std::filesystem::__cxx11::operator/(&local_168,__lhs,&local_1b8);
      cVar5 = std::filesystem::status(&local_168);
      if ((cVar5 != '\0') && (cVar5 != -1)) {
        get_reg();
        ggml_backend_registry::load_backend(&get_reg::reg,&local_168,true);
      }
      std::filesystem::__cxx11::path::~path(&local_168);
      std::filesystem::__cxx11::path::~path(&local_1b8);
    } while (((cVar5 == -1) || (cVar5 == '\0')) && (__lhs = __lhs + 1, __lhs != ppVar15));
  }
LAB_001055e8:
  std::filesystem::__cxx11::path::~path(&local_120);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector(&local_d8);
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::filesystem::__cxx11::path::~path(&local_88);
  std::filesystem::__cxx11::path::~path(&local_60);
  return extraout_RAX;
}

Assistant:

static ggml_backend_reg_t ggml_backend_load_best(const char * name, bool silent, const char * user_search_path) {
    // enumerate all the files that match [lib]ggml-name-*.[so|dll] in the search paths
    const fs::path name_path = fs::u8path(name);
    const fs::path file_prefix = backend_filename_prefix().native() + name_path.native() + fs::u8path("-").native();
    const fs::path file_extension = backend_filename_extension();

    std::vector<fs::path> search_paths;
    if (user_search_path == nullptr) {
        // default search paths: executable directory, current directory
        search_paths.push_back(get_executable_path());
        search_paths.push_back(fs::current_path());
    } else {
        search_paths.push_back(fs::u8path(user_search_path));
    }

    int best_score = 0;
    fs::path best_path;

    for (const auto & search_path : search_paths) {
        if (!fs::exists(search_path)) {
            GGML_LOG_DEBUG("%s: search path %s does not exist\n", __func__, path_str(search_path).c_str());
            continue;
        }
        fs::directory_iterator dir_it(search_path, fs::directory_options::skip_permission_denied);
        for (const auto & entry : dir_it) {
            if (entry.is_regular_file()) {
                auto filename = entry.path().filename();
                auto ext = entry.path().extension();
                if (filename.native().find(file_prefix) == 0 && ext == file_extension) {
                    dl_handle_ptr handle { dl_load_library(entry) };
                    if (!handle && !silent) {
                        GGML_LOG_ERROR("%s: failed to load %s\n", __func__, path_str(entry.path()).c_str());
                    }
                    if (handle) {
                        auto score_fn = (ggml_backend_score_t) dl_get_sym(handle.get(), "ggml_backend_score");
                        if (score_fn) {
                            int s = score_fn();
#ifndef NDEBUG
                            GGML_LOG_DEBUG("%s: %s score: %d\n", __func__, path_str(entry.path()).c_str(), s);
#endif
                            if (s > best_score) {
                                best_score = s;
                                best_path = entry.path();
                            }
                        } else {
                            if (!silent) {
                                GGML_LOG_INFO("%s: failed to find ggml_backend_score in %s\n", __func__, path_str(entry.path()).c_str());
                            }
                        }
                    }
                }
            }
        }
    }

    if (best_score == 0) {
        // try to load the base backend
        for (const auto & search_path : search_paths) {
            fs::path filename = backend_filename_prefix().native() + name_path.native() + backend_filename_extension().native();
            fs::path path = search_path / filename;
            if (fs::exists(path)) {
                return get_reg().load_backend(path, silent);
            }
        }
        return nullptr;
    }

    return get_reg().load_backend(best_path, silent);
}